

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

int64 Time::ticks(void)

{
  undefined1 local_18 [8];
  timespec ts;
  
  clock_gettime(1,(timespec *)local_18);
  return (long)local_18 * 1000 + ts.tv_sec / 1000000;
}

Assistant:

int64 Time::ticks()
{
#ifdef _WIN32
  return GetTickCount64();
#else
  struct timespec ts;
  clock_gettime(CLOCK_MONOTONIC, &ts);
  return (int64)ts.tv_sec * 1000 + ts.tv_nsec / 1000000;
#endif
}